

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

void adjust_capacity(ch_table *table,uint32_t capacity)

{
  undefined4 uVar1;
  uint uVar2;
  ch_table_entry *pcVar3;
  ch_table_entry *pcVar4;
  ch_table_entry *destination;
  ch_table_entry *entry;
  uint32_t i_1;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 local_30;
  uint local_24;
  ch_table_entry *pcStack_20;
  uint32_t i;
  ch_table_entry *entries;
  ch_table *pcStack_10;
  uint32_t capacity_local;
  ch_table *table_local;
  
  entries._4_4_ = capacity;
  pcStack_10 = table;
  pcStack_20 = (ch_table_entry *)malloc((ulong)capacity * 0x18);
  for (local_24 = 0; pcVar3 = pcStack_20, uVar2 = local_24, local_24 < entries._4_4_;
      local_24 = local_24 + 1) {
    pcStack_20[local_24].key = (ch_string *)0x0;
    memset(&local_30,0,8);
    *(ulong *)&pcVar3[uVar2].value = CONCAT44(i_1,2);
    pcVar3[uVar2].value.field_1 = local_30;
  }
  pcStack_10->size = 0;
  for (entry._4_4_ = 0; entry._4_4_ < pcStack_10->capacity; entry._4_4_ = entry._4_4_ + 1) {
    pcVar3 = pcStack_10->entries + entry._4_4_;
    if (pcVar3->key != (ch_string *)0x0) {
      pcVar4 = find_entry(pcStack_20,entries._4_4_,pcVar3->key);
      pcVar4->key = pcVar3->key;
      uVar1 = *(undefined4 *)&(pcVar3->value).field_0x4;
      (pcVar4->value).type = (pcVar3->value).type;
      *(undefined4 *)&(pcVar4->value).field_0x4 = uVar1;
      (pcVar4->value).field_1 = (pcVar3->value).field_1;
      pcStack_10->size = pcStack_10->size + 1;
    }
  }
  free(pcStack_10->entries);
  pcStack_10->entries = pcStack_20;
  pcStack_10->capacity = entries._4_4_;
  return;
}

Assistant:

static void adjust_capacity(ch_table *table, uint32_t capacity) {
  ch_table_entry *entries =
      (ch_table_entry *)malloc(capacity * sizeof(ch_table_entry));
  for (uint32_t i = 0; i < capacity; i++) {
    entries[i].key = NULL;
    entries[i].value = MAKE_NULL();
  }

  table->size = 0;
  for (uint32_t i = 0; i < table->capacity; i++) {
    ch_table_entry *entry = &table->entries[i];

    if (entry->key == NULL)
      continue;

    ch_table_entry *destination = find_entry(entries, capacity, entry->key);
    destination->key = entry->key;
    destination->value = entry->value;
    table->size++;
  }

  free(table->entries);

  table->entries = entries;
  table->capacity = capacity;
}